

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O3

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandedDecl::applyParams
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandedDecl *this,
          Array<capnp::compiler::BrandedDecl> *params,Reader subSource)

{
  BrandScope *pBVar1;
  NullableValue<capnp::compiler::BrandedDecl> *pNVar2;
  Disposer *pDVar3;
  BrandScope *pBVar4;
  undefined1 local_f8 [8];
  BrandScope *local_f0;
  BrandedDecl *local_e8;
  Disposer *local_e0;
  BrandScope *local_d8;
  BrandedDecl local_d0;
  
  if ((this->body).tag == 2) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    pBVar1 = (this->brand).ptr;
    local_e8 = params->ptr;
    local_e0 = (Disposer *)params->size_;
    local_d8 = (BrandScope *)params->disposer;
    params->ptr = (BrandedDecl *)0x0;
    params->size_ = 0;
    BrandScope::setParams
              ((BrandScope *)local_f8,(Array<capnp::compiler::BrandedDecl> *)pBVar1,(Which)&local_e8
               ,subSource);
    pBVar1 = local_f0;
    if (local_f0 == (BrandScope *)0x0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      BrandedDecl(&local_d0,this);
      pBVar4 = local_d0.brand.ptr;
      pDVar3 = local_d0.brand.disposer;
      local_d0.brand.disposer = (Disposer *)local_f8;
      local_d0.brand.ptr = local_f0;
      local_f0 = (BrandScope *)0x0;
      if (pBVar4 != (BrandScope *)0x0) {
        (**pDVar3->_vptr_Disposer)
                  (pDVar3,(pBVar4->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                          (long)&(pBVar4->super_Refcounted).super_Disposer._vptr_Disposer);
      }
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = local_d0.body.tag;
      if (local_d0.body.tag == 2) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
             local_d0.body.field_1._0_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             local_d0.body.field_1._8_8_;
      }
      else if (local_d0.body.tag == 1) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
             local_d0.body.field_1._32_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
             local_d0.body.field_1._16_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
             local_d0.body.field_1._24_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
             local_d0.body.field_1._0_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             local_d0.body.field_1._8_8_;
        *(byte *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) =
             local_d0.body.field_1.space[0x28];
        if (local_d0.body.field_1.space[0x28] == '\x01') {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
               local_d0.body.field_1._80_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) =
               local_d0.body.field_1._88_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
               local_d0.body.field_1._64_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
               local_d0.body.field_1._72_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
               local_d0.body.field_1._48_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
               local_d0.body.field_1._56_8_;
        }
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)local_f8;
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBVar1;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x78) =
           subSource._reader.segment._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x7c) =
           subSource._reader.segment._4_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x80) =
           subSource._reader.capTable._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x84) =
           subSource._reader.capTable._4_4_;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.data = subSource._reader.data;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
           subSource._reader.pointers;
      pNVar2 = &__return_storage_ptr__->ptr;
      *(StructDataBitCount *)((long)&pNVar2->field_1 + 0x98) = subSource._reader.dataSize;
      *(StructPointerCount *)((long)&pNVar2->field_1 + 0x9c) = subSource._reader.pointerCount;
      *(undefined2 *)((long)&pNVar2->field_1 + 0x9e) = subSource._reader._38_2_;
      *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = subSource._reader.nestingLimit
      ;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) =
           subSource._reader._44_4_;
    }
    if (local_e8 != (BrandedDecl *)0x0) {
      (**(local_d8->super_Refcounted).super_Disposer._vptr_Disposer)
                (local_d8,local_e8,0xa8,local_e0,local_e0,
                 kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<BrandedDecl> BrandedDecl::applyParams(
    kj::Array<BrandedDecl> params, Expression::Reader subSource) {
  if (body.is<Resolver::ResolvedParameter>()) {
    return kj::none;
  } else {
    return brand->setParams(kj::mv(params), body.get<Resolver::ResolvedDecl>().kind, subSource)
        .map([&](kj::Own<BrandScope>&& scope) {
      BrandedDecl result = *this;
      result.brand = kj::mv(scope);
      result.source = subSource;
      return result;
    });
  }
}